

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XDataAllocator.cpp
# Opt level: O1

bool __thiscall
Memory::XDataAllocator::Alloc
          (XDataAllocator *this,ULONG_PTR functionStart,DWORD functionSize,ushort pdataCount,
          ushort xdataSize,SecondaryAllocation *allocation)

{
  BYTE *pBVar1;
  XDataAllocationEntry *buffer;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (this->start == (BYTE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/amd64/XDataAllocator.cpp"
                       ,0x32,"(start != nullptr)","start != nullptr");
    if (!bVar3) goto LAB_0075f5af;
    *puVar4 = 0;
  }
  if (this->current == (BYTE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/amd64/XDataAllocator.cpp"
                       ,0x33,"(current != nullptr)","current != nullptr");
    if (!bVar3) goto LAB_0075f5af;
    *puVar4 = 0;
  }
  if (this->current < this->start) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/amd64/XDataAllocator.cpp"
                       ,0x34,"(current >= start)","current >= start");
    if (!bVar3) goto LAB_0075f5af;
    *puVar4 = 0;
  }
  if (0x80 < xdataSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/amd64/XDataAllocator.cpp"
                       ,0x35,"(xdataSize <= (0x80))","xdataSize <= XDATA_SIZE");
    if (!bVar3) goto LAB_0075f5af;
    *puVar4 = 0;
  }
  if (pdataCount != 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/amd64/XDataAllocator.cpp"
                       ,0x36,"(pdataCount == 1)","pdataCount == 1");
    if (!bVar3) {
LAB_0075f5af:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pBVar1 = this->current;
  if ((long)(this->start + ((ulong)this->size - (long)pBVar1)) < 0x80) {
    buffer = this->freeList;
    if (buffer == (XDataAllocationEntry *)0x0) {
      allocation->address = (BYTE *)0x0;
      Output::Trace(XDataAllocatorPhase,L"No space for XDATA.\n");
    }
    else {
      allocation->address = (buffer->super_XDataAllocation).super_SecondaryAllocation.address;
      this->freeList = buffer->next;
      HeapAllocator::Free(&HeapAllocator::Instance,buffer,0x10);
    }
  }
  else {
    allocation->address = pBVar1;
    this->current = pBVar1 + 0x80;
  }
  pBVar1 = allocation->address;
  if (pBVar1 != (BYTE *)0x0) {
    pBVar1[0] = '\0';
    pBVar1[1] = '\0';
    pBVar1[2] = '\0';
    pBVar1[3] = '\0';
  }
  return pBVar1 != (BYTE *)0x0;
}

Assistant:

bool XDataAllocator::Alloc(ULONG_PTR functionStart, DWORD functionSize,
    ushort pdataCount, ushort xdataSize, SecondaryAllocation* allocation)
{
    XDataAllocation* xdata = static_cast<XDataAllocation*>(allocation);
    Assert(start != nullptr);
    Assert(current != nullptr);
    Assert(current >= start);
    Assert(xdataSize <= XDATA_SIZE);
    Assert(pdataCount == 1);

    // Allocate a new xdata entry
    if((End() - current) >= XDATA_SIZE)
    {
        xdata->address = current;
        current += XDATA_SIZE;
    } // try allocating from the free list
    else if(freeList)
    {
        auto entry = freeList;
        xdata->address = entry->address;
        this->freeList = entry->next;
        HeapDelete(entry);
    }
    else
    {
        xdata->address = nullptr;
        OUTPUT_TRACE(Js::XDataAllocatorPhase, _u("No space for XDATA.\n"));
    }

#ifndef _WIN32
    if (xdata->address)
    {
        ClearHead(xdata->address);  // mark empty .eh_frame
    }
#endif

    return xdata->address != nullptr;
}